

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

int xmlTextReaderSetParserProp(xmlTextReaderPtr reader,int prop,int value)

{
  xmlParserCtxtPtr pxVar1;
  int iVar2;
  xmlParserProperties p;
  
  iVar2 = -1;
  if ((reader != (xmlTextReaderPtr)0x0) && (pxVar1 = reader->ctxt, pxVar1 != (xmlParserCtxtPtr)0x0))
  {
    switch(prop) {
    case 1:
      if (value == 0) {
        *(byte *)&pxVar1->options = (byte)pxVar1->options & 0xfb;
        *(byte *)&pxVar1->loadsubset = (byte)pxVar1->loadsubset & 0xfd;
      }
      else if (pxVar1->loadsubset == 0) {
        if (reader->mode != 0) {
          return -1;
        }
        *(byte *)&pxVar1->options = (byte)pxVar1->options | 4;
        pxVar1->loadsubset = 2;
      }
      break;
    case 2:
      if (value == 0) {
        pxVar1->options = pxVar1->options & 0xfffffff7;
        *(byte *)&pxVar1->loadsubset = (byte)pxVar1->loadsubset & 0xfb;
      }
      else {
        pxVar1->options = pxVar1->options | 8;
        *(byte *)&pxVar1->loadsubset = (byte)pxVar1->loadsubset | 4;
      }
      break;
    case 3:
      if (value == 0) {
        pxVar1->options = pxVar1->options & 0xffffffef;
        pxVar1->validate = 0;
      }
      else {
        pxVar1->options = pxVar1->options | 0x10;
        pxVar1->validate = 1;
        reader->validate = XML_TEXTREADER_VALIDATE_DTD;
      }
      break;
    case 4:
      if (value == 0) {
        pxVar1->options = pxVar1->options & 0xfffffffd;
        pxVar1->replaceEntities = 0;
      }
      else {
        pxVar1->options = pxVar1->options | 2;
        pxVar1->replaceEntities = 1;
      }
      break;
    default:
      goto switchD_00172714_default;
    }
    iVar2 = 0;
  }
switchD_00172714_default:
  return iVar2;
}

Assistant:

int
xmlTextReaderSetParserProp(xmlTextReaderPtr reader, int prop, int value) {
    xmlParserProperties p = (xmlParserProperties) prop;
    xmlParserCtxtPtr ctxt;

    if ((reader == NULL) || (reader->ctxt == NULL))
	return(-1);
    ctxt = reader->ctxt;

    switch (p) {
        case XML_PARSER_LOADDTD:
	    if (value != 0) {
		if (ctxt->loadsubset == 0) {
		    if (reader->mode != XML_TEXTREADER_MODE_INITIAL)
			return(-1);
                    ctxt->options |= XML_PARSE_DTDLOAD;
		    ctxt->loadsubset |= XML_DETECT_IDS;
		}
	    } else {
                ctxt->options &= ~XML_PARSE_DTDLOAD;
		ctxt->loadsubset &= ~XML_DETECT_IDS;
	    }
	    return(0);
        case XML_PARSER_DEFAULTATTRS:
	    if (value != 0) {
                ctxt->options |= XML_PARSE_DTDATTR;
		ctxt->loadsubset |= XML_COMPLETE_ATTRS;
	    } else {
                ctxt->options &= ~XML_PARSE_DTDATTR;
		ctxt->loadsubset &= ~XML_COMPLETE_ATTRS;
	    }
	    return(0);
        case XML_PARSER_VALIDATE:
	    if (value != 0) {
                ctxt->options |= XML_PARSE_DTDVALID;
		ctxt->validate = 1;
		reader->validate = XML_TEXTREADER_VALIDATE_DTD;
	    } else {
                ctxt->options &= ~XML_PARSE_DTDVALID;
		ctxt->validate = 0;
	    }
	    return(0);
        case XML_PARSER_SUBST_ENTITIES:
	    if (value != 0) {
                ctxt->options |= XML_PARSE_NOENT;
		ctxt->replaceEntities = 1;
	    } else {
                ctxt->options &= ~XML_PARSE_NOENT;
		ctxt->replaceEntities = 0;
	    }
	    return(0);
    }
    return(-1);
}